

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event_finder.cpp
# Opt level: O3

void __thiscall sc_core::sc_event_finder::report_error(sc_event_finder *this,char *id,char *add_msg)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  undefined4 extraout_var;
  stringstream msg;
  char *local_1c8;
  char local_1b8 [16];
  stringstream local_1a8 [16];
  long local_198 [47];
  char *pcVar4;
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  if (add_msg != (char *)0x0) {
    sVar3 = strlen(add_msg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,add_msg,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,": ",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"port \'",6);
  pcVar4 = (this->m_port->super_sc_object).m_name._M_dataplus._M_p;
  iVar1 = (int)(ostream *)local_198;
  if (pcVar4 == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar3 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar4,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\' (",3);
  iVar2 = (*(this->m_port->super_sc_object)._vptr_sc_object[3])();
  pcVar4 = (char *)CONCAT44(extraout_var,iVar2);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar3 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar4,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,")",1);
  std::__cxx11::stringbuf::str();
  sc_report_handler::report
            (SC_ERROR,id,local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/communication/sc_event_finder.cpp"
             ,0x33);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void
sc_event_finder::report_error( const char* id, const char* add_msg ) const
{
    std::stringstream msg;
    if (add_msg != 0)
        msg << add_msg << ": ";
    msg << "port '" << m_port.name() << "' (" << m_port.kind() << ")";
    SC_REPORT_ERROR( id, msg.str().c_str() );
}